

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

ExprDoWhile * AnalyzeDoWhile(ExpressionContext *ctx,SynDoWhile *syntax)

{
  TypeBase *pTVar1;
  ScopeData *pSVar2;
  ExprBase *pEVar3;
  int iVar4;
  ExprBase *pEVar5;
  undefined4 extraout_var;
  SynBase *pSVar7;
  ExprDoWhile *pEVar8;
  FunctionData *onwerFunction;
  IntrusiveList<ExprBase> expressions;
  IntrusiveList<ExprBase> local_48;
  ExprBase *local_38;
  ExprBase *pEVar6;
  undefined4 extraout_var_00;
  
  ExpressionContext::PushLoopScope(ctx,true,true);
  local_48.head = (ExprBase *)0x0;
  local_48.tail = (ExprBase *)0x0;
  for (pSVar7 = (syntax->expressions).head; pSVar7 != (SynBase *)0x0; pSVar7 = pSVar7->next) {
    pEVar5 = AnalyzeStatement(ctx,pSVar7);
    IntrusiveList<ExprBase>::push_back(&local_48,pEVar5);
  }
  pEVar5 = AnalyzeExpression(ctx,syntax->condition);
  local_38 = CreateConditionCast(ctx,pEVar5->source,pEVar5);
  iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
  pEVar3 = local_48.tail;
  pEVar5 = local_48.head;
  pEVar6 = (ExprBase *)CONCAT44(extraout_var,iVar4);
  pTVar1 = ctx->typeVoid;
  pSVar7 = &ExpressionContext::MakeInternal(ctx,&syntax->super_SynBase)->super_SynBase;
  for (pSVar2 = ctx->scope; (pSVar2 != (ScopeData *)0x0 && (pSVar2->ownerType == (TypeBase *)0x0));
      pSVar2 = pSVar2->scope) {
    onwerFunction = pSVar2->ownerFunction;
    if (onwerFunction != (FunctionData *)0x0) goto LAB_00206b52;
  }
  onwerFunction = (FunctionData *)0x0;
LAB_00206b52:
  pSVar7 = (SynBase *)CreateBlockUpvalueClose(ctx,pSVar7,onwerFunction,ctx->scope);
  pEVar6->typeID = 0x36;
  pEVar6->source = &syntax->super_SynBase;
  pEVar6->type = pTVar1;
  pEVar6->next = (ExprBase *)0x0;
  pEVar6->listed = false;
  pEVar6->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003f6c90;
  pEVar6[1]._vptr_ExprBase = (_func_int **)pEVar5;
  *(ExprBase **)&pEVar6[1].typeID = pEVar3;
  pEVar6[1].source = pSVar7;
  ExpressionContext::PopScope(ctx,SCOPE_LOOP,true);
  iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
  pEVar8 = (ExprDoWhile *)CONCAT44(extraout_var_00,iVar4);
  pTVar1 = ctx->typeVoid;
  (pEVar8->super_ExprBase).typeID = 0x32;
  (pEVar8->super_ExprBase).source = &syntax->super_SynBase;
  (pEVar8->super_ExprBase).type = pTVar1;
  (pEVar8->super_ExprBase).next = (ExprBase *)0x0;
  (pEVar8->super_ExprBase).listed = false;
  (pEVar8->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_003f7048;
  pEVar8->body = pEVar6;
  pEVar8->condition = local_38;
  return pEVar8;
}

Assistant:

ExprDoWhile* AnalyzeDoWhile(ExpressionContext &ctx, SynDoWhile *syntax)
{
	ctx.PushLoopScope(true, true);

	IntrusiveList<ExprBase> expressions;

	for(SynBase *expression = syntax->expressions.head; expression; expression = expression->next)
		expressions.push_back(AnalyzeStatement(ctx, expression));

	ExprBase *condition = AnalyzeExpression(ctx, syntax->condition);

	condition = CreateConditionCast(ctx, condition->source, condition);

	ExprBase *block = new (ctx.get<ExprBlock>()) ExprBlock(syntax, ctx.typeVoid, expressions, CreateBlockUpvalueClose(ctx, ctx.MakeInternal(syntax), ctx.GetCurrentFunction(ctx.scope), ctx.scope));

	ctx.PopScope(SCOPE_LOOP);

	return new (ctx.get<ExprDoWhile>()) ExprDoWhile(syntax, ctx.typeVoid, block, condition);
}